

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  char cVar1;
  pointer ppTVar2;
  long *plVar3;
  cmLocalGenerator *pcVar4;
  bool bVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  ostream *poVar8;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar9;
  pointer ppTVar10;
  pointer path;
  char cVar11;
  allocator local_2a1;
  cmake *local_2a0;
  string local_298;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string inc;
  
  ppTVar10 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar10 == ppTVar2) {
      return;
    }
    local_2a0 = (cmake *)(*ppTVar10)->LinkImplItem;
    plVar3 = *(long **)&(local_2a0->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (plVar3 == (long *)0x0) {
      cVar11 = '\0';
    }
    else {
      cVar11 = *(char *)(*plVar3 + 0x230);
    }
    cVar1 = *(char *)&(local_2a0->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (((*ppTVar10)->ge).x_,tgt->LocalGenerator,config,false,tgt,dagChecker,
                        language);
    std::__cxx11::string::string((string *)&inc,pcVar7,(allocator *)&usedIncludes);
    cmSystemTools::ExpandListArgument(&inc,&entryIncludes,false);
    std::__cxx11::string::~string((string *)&inc);
    usedIncludes._M_dataplus._M_p = (pointer)&usedIncludes.field_2;
    usedIncludes._M_string_length = 0;
    usedIncludes.field_2._M_local_buf[0] = '\0';
    for (path = entryIncludes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        path != entryIncludes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
      if ((cVar11 != '\0') &&
         (bVar5 = cmsys::SystemTools::FileExists((path->_M_dataplus)._M_p), !bVar5)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        MVar9 = FATAL_ERROR;
        if (cVar1 != '\0') {
          PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
          if (PVar6 != OLD) {
            if (PVar6 != WARN) goto LAB_003b5aab;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_298,(cmPolicies *)0x1b,id_00);
            poVar8 = std::operator<<((ostream *)&inc,(string *)&local_298);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_298);
          }
          MVar9 = AUTHOR_WARNING;
        }
LAB_003b5aab:
        poVar8 = std::operator<<((ostream *)&inc,"Imported target \"");
        poVar8 = std::operator<<(poVar8,(string *)local_2a0);
        poVar8 = std::operator<<(poVar8,"\" includes non-existent path\n  \"");
        poVar8 = std::operator<<(poVar8,(string *)path);
        std::operator<<(poVar8,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar4 = tgt->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(pcVar4,MVar9,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        goto LAB_003b5b29;
      }
      bVar5 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        if ((((cmLinkItem *)&local_2a0->Generators)->super_string)._M_string_length == 0) {
          PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar6 == OLD) {
            bVar5 = true;
LAB_003b57ee:
            MVar9 = FATAL_ERROR;
          }
          else {
            if (PVar6 != WARN) {
              bVar5 = false;
              goto LAB_003b57ee;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_298,(cmPolicies *)0x15,id);
            poVar8 = std::operator<<((ostream *)&inc,(string *)&local_298);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_298);
            bVar5 = false;
            MVar9 = AUTHOR_WARNING;
          }
          poVar8 = std::operator<<((ostream *)&inc,
                                   "Found relative path while evaluating include directories of \"")
          ;
          poVar8 = std::operator<<(poVar8,(string *)&tgt->Target->Name);
          poVar8 = std::operator<<(poVar8,"\":\n  \"");
          poVar8 = std::operator<<(poVar8,(string *)path);
          std::operator<<(poVar8,"\"\n");
          if (!bVar5) goto LAB_003b5846;
        }
        else {
          poVar8 = std::operator<<((ostream *)&inc,"Target \"");
          poVar8 = std::operator<<(poVar8,(string *)local_2a0);
          poVar8 = std::operator<<(poVar8,
                                   "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                  );
          poVar8 = std::operator<<(poVar8,(string *)path);
          std::operator<<(poVar8,"\"");
          MVar9 = FATAL_ERROR;
LAB_003b5846:
          pcVar4 = tgt->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar4,MVar9,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          if (MVar9 == FATAL_ERROR) {
LAB_003b5b29:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
            std::__cxx11::string::~string((string *)&usedIncludes);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entryIncludes);
            return;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
      }
      bVar5 = cmSystemTools::IsOff((path->_M_dataplus)._M_p);
      if (!bVar5) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
      }
      std::__cxx11::string::string((string *)&inc,(string *)path);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&local_298,uniqueIncludes,(value_type *)&inc);
      if ((local_298.field_2._M_local_buf[0] == '\x01') &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(includes,(value_type *)&inc), debugIncludes)) {
        std::operator+(&local_208," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inc);
        std::operator+(&local_298,&local_208,"\n");
        std::__cxx11::string::append((string *)&usedIncludes);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_208);
      }
      std::__cxx11::string::~string((string *)&inc);
    }
    if (usedIncludes._M_string_length != 0) {
      local_2a0 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      std::__cxx11::string::string((string *)&local_1e8,"Used includes for target ",&local_2a1);
      std::operator+(&local_1c8,&local_1e8,&tgt->Target->Name);
      std::operator+(&local_208,&local_1c8,":\n");
      std::operator+(&local_298,&local_208,&usedIncludes);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)&inc,&(((*ppTVar10)->ge).x_)->Backtrace);
      cmake::IssueMessage(local_2a0,LOG,&local_298,(cmListFileBacktrace *)&inc,false);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&inc);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    std::__cxx11::string::~string((string *)&usedIncludes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryIncludes);
    ppTVar10 = ppTVar10 + 1;
  } while( true );
}

Assistant:

static void processIncludeDirectories(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}